

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

void __thiscall fp::Algorithm::Algorithm(Algorithm *this)

{
  Algorithm *pAVar1;
  _Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *p_Var2;
  long lVar3;
  long lVar4;
  
  this->path_found_ = false;
  this->need_newpath_ = true;
  this->temp_goal_ = false;
  this->path_blocked = true;
  this->visited_Count = 0;
  Maze::Maze(&this->maze_info);
  this->current_direction_ = 'N';
  this->block_direction_ = '\0';
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  *(undefined8 *)(this->current_node_)._M_elems = 0;
  *(undefined8 *)(this->parent_node_)._M_elems = 0;
  std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::_M_initialize_map
            ((_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             &this->stack_,0);
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->path_stack_).c.
  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::_M_initialize_map
            ((_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             &this->path_stack_,0);
  lVar3 = 0;
  pAVar1 = this;
  do {
    lVar4 = 0;
    do {
      p_Var2 = (_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
               ((long)&(((stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
                          *)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 1))->c).
                       super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl + lVar4);
      *(undefined8 *)((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 9) + lVar4)
           = 0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 10) + lVar4) = 0;
      *(undefined8 *)
       ((long)&((iterator *)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 7))->_M_cur
       + lVar4) = 0;
      *(undefined8 *)((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 8) + lVar4)
           = 0;
      *(undefined8 *)((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 5) + lVar4)
           = 0;
      *(undefined8 *)((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 6) + lVar4)
           = 0;
      *(undefined8 *)
       ((long)&((iterator *)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 3))->_M_cur
       + lVar4) = 0;
      *(undefined8 *)((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 4) + lVar4)
           = 0;
      (p_Var2->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      *(undefined8 *)((long)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + 2) + lVar4)
           = 0;
      *(undefined8 *)
       ((long)&((Node *)(&(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_ + -1))->dist_ +
       lVar4) = 0;
      *(undefined8 *)
       ((long)(pAVar1->node_info)._M_elems[0]._M_elems[0].parent_node_._M_elems + lVar4) = 0;
      std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
      _M_initialize_map(p_Var2,0);
      lVar4 = lVar4 + 0x60;
    } while (lVar4 != 0x600);
    lVar3 = lVar3 + 0x600;
    pAVar1 = (Algorithm *)&(pAVar1->node_info)._M_elems[0]._M_elems[3].child_node_;
  } while (lVar3 != 0x6000);
  memset(&this->node_master_,0,0x6000);
  lVar3 = 0x64d0;
  pAVar1 = this;
  do {
    lVar3 = lVar3 + 0x600;
    lVar4 = 0;
    do {
      p_Var2 = (_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
               ((long)&(((stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
                          *)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 1))->c).
                       super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl + lVar4);
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 9) + lVar4) = 0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 10) + lVar4) = 0;
      *(undefined8 *)
       ((long)&((iterator *)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 7))->
               _M_cur + lVar4) = 0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 8) + lVar4) = 0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 5) + lVar4) = 0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 6) + lVar4) = 0;
      *(undefined8 *)
       ((long)&((iterator *)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 3))->
               _M_cur + lVar4) = 0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 4) + lVar4) = 0;
      (p_Var2->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      *(undefined8 *)
       ((long)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + 2) + lVar4) = 0;
      *(undefined8 *)
       ((long)&((Node *)(&(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_ + -1))->dist_
       + lVar4) = 0;
      *(undefined8 *)
       ((long)(pAVar1->node_master_)._M_elems[0]._M_elems[0].parent_node_._M_elems + lVar4) = 0;
      std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
      _M_initialize_map(p_Var2,0);
      lVar4 = lVar4 + 0x60;
    } while (lVar4 != 0x600);
    pAVar1 = (Algorithm *)&(pAVar1->node_info)._M_elems[0]._M_elems[3].child_node_;
  } while (lVar3 != 0xc4d0);
  memset(&this->explored_node_,0,0x200);
  *(undefined8 *)(this->goal1_)._M_elems = 0x700000008;
  *(undefined8 *)(this->goal2_)._M_elems = 0x800000008;
  *(undefined8 *)(this->goal3_)._M_elems = 0x800000007;
  *(undefined8 *)(this->goal4_)._M_elems = 0x700000007;
  *(undefined8 *)(this->end_goal_)._M_elems = 0;
  return;
}

Assistant:

Algorithm() : path_found_{false}, need_newpath_{true}, current_direction_{'N'}, goal1_{8, 7},
                      goal2_{8, 8}, goal3_{7, 8}, goal4_{7, 7},
                      end_goal_{}, current_node_{}, block_direction_{}, stack_{}, path_stack_{}, parent_node_{},
                      visited_node_{}, node_master_{}, explored_node_{}, robot_{nullptr} {

        }